

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O1

void kv_cmp_key_str_test(void)

{
  int iVar1;
  size_t sVar2;
  ushort *puVar3;
  bid_t *pbVar4;
  bid_t bVar5;
  char *__s;
  long lVar6;
  ulong __n;
  void *tmp;
  timeval __test_begin;
  bid_t bStack_188;
  timeval tStack_180;
  btree_kv_ops bStack_170;
  char *pcStack_f8;
  code *pcStack_f0;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined1 local_d0 [8];
  undefined1 local_c8 [8];
  char local_c0 [8];
  timeval local_b8;
  btree_kv_ops local_a8;
  
  lVar6 = 0;
  pcStack_f0 = (code *)0x10472b;
  gettimeofday(&local_b8,(__timezone_ptr_t)0x0);
  pcStack_f0 = (code *)0x104730;
  memleak_start();
  local_e0 = 0;
  pcStack_f0 = (code *)0x104743;
  btree_str_kv_get_kb64_vb64(&local_a8);
  do {
    __s = *(char **)((long)&DAT_00109da0 + lVar6);
    pcStack_f0 = (code *)0x104756;
    sVar2 = strlen(__s);
    __n = sVar2 & 0xffff;
    pcStack_f0 = (code *)0x104763;
    puVar3 = (ushort *)malloc(__n + 2);
    *puVar3 = (ushort)sVar2 << 8 | (ushort)sVar2 >> 8;
    pcStack_f0 = (code *)0x104780;
    memcpy(puVar3 + 1,__s,__n);
    *(ushort **)(local_d0 + lVar6 + -8) = puVar3;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x20);
  pcStack_f0 = (code *)0x1047a0;
  iVar1 = (*local_a8.cmp)(&local_d8,&local_d8,(void *)0x0);
  if (iVar1 == 0) {
    pcStack_f0 = (code *)0x1047bb;
    iVar1 = (*local_a8.cmp)(&local_d8,local_d0,(void *)0x0);
    if (iVar1 < 1) goto LAB_00104866;
    __s = local_c0;
    pcStack_f0 = (code *)0x1047d9;
    iVar1 = (*local_a8.cmp)(local_c8,__s,(void *)0x0);
    if (iVar1 != -6) goto LAB_0010486b;
    pcStack_f0 = (code *)0x1047f3;
    iVar1 = (*local_a8.cmp)(&local_d8,__s,(void *)0x0);
    if (iVar1 < 1) goto LAB_00104870;
    pcStack_f0 = (code *)0x10480a;
    iVar1 = (*local_a8.cmp)(&local_e0,&local_d8,(void *)0x0);
    if (iVar1 != -1) goto LAB_00104875;
    pcStack_f0 = (code *)0x104822;
    iVar1 = (*local_a8.cmp)(&local_d8,&local_e0,(void *)0x0);
    if (iVar1 == 1) {
      pcStack_f0 = (code *)0x104838;
      iVar1 = (*local_a8.cmp)(&local_e0,&local_e0,(void *)0x0);
      if (iVar1 == 0) {
        pcStack_f0 = (code *)0x104850;
        kv_cmp_key_str_test();
        return;
      }
      goto LAB_0010487f;
    }
  }
  else {
    pcStack_f0 = (code *)0x104866;
    kv_cmp_key_str_test();
LAB_00104866:
    pcStack_f0 = (code *)0x10486b;
    kv_cmp_key_str_test();
LAB_0010486b:
    pcStack_f0 = (code *)0x104870;
    kv_cmp_key_str_test();
LAB_00104870:
    pcStack_f0 = (code *)0x104875;
    kv_cmp_key_str_test();
LAB_00104875:
    pcStack_f0 = (code *)0x10487a;
    kv_cmp_key_str_test();
  }
  pcStack_f0 = (code *)0x10487f;
  kv_cmp_key_str_test();
LAB_0010487f:
  pcStack_f0 = kv_bid_to_value_to_bid_test;
  kv_cmp_key_str_test();
  pcStack_f8 = __s;
  pcStack_f0 = (code *)__n;
  gettimeofday(&tStack_180,(__timezone_ptr_t)0x0);
  memleak_start();
  btree_str_kv_get_kb64_vb64(&bStack_170);
  bStack_188 = 10;
  pbVar4 = (bid_t *)(*bStack_170.bid2value)(&bStack_188);
  if (*pbVar4 != bStack_188) {
    kv_bid_to_value_to_bid_test();
  }
  bVar5 = (*bStack_170.value2bid)(pbVar4);
  if (bVar5 != bStack_188) {
    kv_bid_to_value_to_bid_test();
  }
  kv_bid_to_value_to_bid_test();
  return;
}

Assistant:

void kv_cmp_key_str_test()
{

    TEST_INIT();
    memleak_start();

    btree_kv_ops *kv_ops;
    int cmp;
    const char *keys[] = {"string",
                          "srting",
                          "longstring",
                          "longstringsuffix"};

    int n =  sizeof(keys)/sizeof(void *);
    void **key_ptrs = alca(void *, n);
    void *tmp = NULL;


    kv_ops = alca(btree_kv_ops, 1);
    btree_str_kv_get_kb64_vb64(kv_ops);

    // construct key_ptrs
    for (int i = 0; i < n; i++){
        // omit null terminator
        construct_key_ptr(keys[i], strlen(keys[i]), &key_ptrs[i]);
    }


    // compare strings equal length equal values
    cmp = kv_ops->cmp(&key_ptrs[0], &key_ptrs[0], NULL);
    TEST_CHK( cmp == 0 );

    // compare strings equal length diff values
    cmp = kv_ops->cmp(&key_ptrs[0], &key_ptrs[1], NULL);
    TEST_CHK( cmp > 0 );

    // compare strings diff length equal substrings
    cmp = kv_ops->cmp(&key_ptrs[2], &key_ptrs[3], NULL);
    TEST_CHK(cmp == ((int)strlen(keys[2]) - (int)strlen(keys[3])) );

    // compare strings diff length diff substrings
    cmp = kv_ops->cmp(&key_ptrs[0], &key_ptrs[3], NULL);
    TEST_CHK( cmp > 0 );

    // key1 is NULL
    cmp = kv_ops->cmp(&tmp, &key_ptrs[0], NULL);
    TEST_CHK( cmp == -1 );

    // key2 is NULL
    cmp = kv_ops->cmp(&key_ptrs[0], &tmp, NULL);
    TEST_CHK( cmp == 1 );

    // key1 and key2 are NULL
    cmp = kv_ops->cmp(&tmp, &tmp, NULL);
    TEST_CHK( cmp == 0 );

    freevars(key_ptrs, n);
    memleak_end();
    TEST_RESULT("kv_cmp_key_str_test");
}